

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

void btPlaneSpace1<btVector3>(btVector3 *n,btVector3 *p,btVector3 *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  btScalar *pbVar6;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  btScalar k_1;
  btScalar a_1;
  btScalar k;
  btScalar a;
  
  pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
  bVar7 = btFabs(pbVar6[2]);
  if (bVar7 <= 0.70710677) {
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar1 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar2 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar3 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar4 = pbVar6[1];
    bVar7 = btSqrt(0.0);
    fVar9 = 1.0 / bVar7;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar6 = -fVar5 * fVar9;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar6[1] = fVar5 * fVar9;
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar6[2] = 0.0;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    fVar8 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    *pbVar6 = -fVar5 * fVar8;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    fVar8 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    pbVar6[1] = fVar5 * fVar8;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    pbVar6[2] = (fVar1 * fVar2 + fVar3 * fVar4) * fVar9;
  }
  else {
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar1 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar2 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar3 = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar4 = pbVar6[2];
    bVar7 = btSqrt(0.0);
    fVar8 = 1.0 / bVar7;
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    *pbVar6 = 0.0;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar6[1] = -fVar5 * fVar8;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar5 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    pbVar6[2] = fVar5 * fVar8;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    *pbVar6 = (fVar1 * fVar2 + fVar3 * fVar4) * fVar8;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar1 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    fVar2 = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    pbVar6[1] = -fVar1 * fVar2;
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    fVar1 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(in_RSI);
    fVar2 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(in_RDX);
    pbVar6[2] = fVar1 * fVar2;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void btPlaneSpace1 (const T& n, T& p, T& q)
{
  if (btFabs(n[2]) > SIMDSQRT12) {
    // choose p in y-z plane
    btScalar a = n[1]*n[1] + n[2]*n[2];
    btScalar k = btRecipSqrt (a);
    p[0] = 0;
	p[1] = -n[2]*k;
	p[2] = n[1]*k;
    // set q = n x p
    q[0] = a*k;
	q[1] = -n[0]*p[2];
	q[2] = n[0]*p[1];
  }
  else {
    // choose p in x-y plane
    btScalar a = n[0]*n[0] + n[1]*n[1];
    btScalar k = btRecipSqrt (a);
    p[0] = -n[1]*k;
	p[1] = n[0]*k;
	p[2] = 0;
    // set q = n x p
    q[0] = -n[2]*p[1];
	q[1] = n[2]*p[0];
	q[2] = a*k;
  }
}